

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::prim::print_primspec_abi_cxx11_
          (string *__return_storage_ptr__,prim *this,PrimSpec *primspec,uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t uVar3;
  uint32_t n_02;
  size_t i;
  ulong uVar4;
  uint indent_00;
  long lVar5;
  pprint *this_00;
  long lVar6;
  stringstream ss;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  this_00 = (pprint *)((ulong)primspec & 0xffffffff);
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1f8,this_00,n);
  poVar2 = std::operator<<(local_1a8,(string *)&local_1f8);
  tinyusdz::to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)this,s);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  std::operator<<(poVar2," ");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (*(long *)(this + 0x10) != 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (this + 8),"Model");
    if (!bVar1) {
      poVar2 = std::operator<<(local_1a8,(string *)(this + 8));
      std::operator<<(poVar2," ");
    }
  }
  poVar2 = std::operator<<(local_1a8,"\"");
  poVar2 = std::operator<<(poVar2,(string *)(this + 0x28));
  std::operator<<(poVar2,"\"\n");
  bVar1 = PrimMetas::authored((PrimMetas *)(this + 0x138));
  uVar3 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)primspec & 0xffffffff),n_00);
    poVar2 = std::operator<<(local_1a8,(string *)&local_1f8);
    std::operator<<(poVar2,"(\n");
    std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_
              (&local_1f8,(tinyusdz *)(this + 0x138),(PrimMeta *)(ulong)((int)primspec + 1),indent);
    std::operator<<(local_1a8,(string *)&local_1f8);
    std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)primspec & 0xffffffff),n_01);
    poVar2 = std::operator<<(local_1a8,(string *)&local_1f8);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::_M_dispose();
    uVar3 = extraout_EDX;
  }
  indent_00 = (int)primspec + 1;
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)primspec & 0xffffffff),uVar3);
  poVar2 = std::operator<<(local_1a8,(string *)&local_1f8);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::_M_dispose();
  print_props(&local_1f8,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x60),indent_00);
  std::operator<<(local_1a8,(string *)&local_1f8);
  std::__cxx11::string::_M_dispose();
  lVar6 = 0;
  uVar4 = 0;
  while( true ) {
    lVar5 = *(long *)(this + 0x48);
    uVar3 = 0x568;
    if ((ulong)((*(long *)(this + 0x50) - lVar5) / 0x568) <= uVar4) break;
    if (uVar4 != 0) {
      uVar3 = 0x568;
      pprint::Indent_abi_cxx11_
                (&local_1f8,this_00,(uint32_t)((*(long *)(this + 0x50) - lVar5) % 0x568));
      poVar2 = std::operator<<(local_1a8,(string *)&local_1f8);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::_M_dispose();
      lVar5 = *(long *)(this + 0x48);
    }
    print_primspec_abi_cxx11_(&local_1f8,(prim *)(lVar5 + lVar6),(PrimSpec *)(ulong)indent_00,uVar3)
    ;
    std::operator<<(local_1a8,(string *)&local_1f8);
    std::__cxx11::string::_M_dispose();
    uVar4 = uVar4 + 1;
    lVar6 = lVar6 + 0x568;
  }
  print_variantSetSpecStmt
            (&local_1f8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
              *)(this + 0xc0),indent_00);
  std::operator<<(local_1a8,(string *)&local_1f8);
  std::__cxx11::string::_M_dispose();
  pprint::Indent_abi_cxx11_(&local_1f8,this_00,n_02);
  poVar2 = std::operator<<(local_1a8,(string *)&local_1f8);
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_primspec(const PrimSpec &primspec, const uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(primspec.specifier()) << " ";
  if (primspec.typeName().empty() || primspec.typeName() == "Model") {
    // do not emit typeName
  } else {
    ss << primspec.typeName() << " ";
  }

  ss << "\"" << primspec.name() << "\"\n";

  if (primspec.metas().authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(primspec.metas(), indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_props(primspec.props(), indent + 1);

  // TODO: print according to primChildren metadatum
  for (size_t i = 0; i < primspec.children().size(); i++) {
    if (i > 0) {
      ss << pprint::Indent(indent) << "\n";
    }
    ss << print_primspec(primspec.children()[i], indent + 1);
  }

  // ss << "# variant \n";
  ss << print_variantSetSpecStmt(primspec.variantSets(), indent + 1);

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}